

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha.c
# Opt level: O1

void update_all_library_gots_cold_6(void)

{
  FILE *__stream;
  uint uVar1;
  uint uVar2;
  
  __stream = _stderr;
  uVar1 = gotcha_gettid();
  uVar2 = getpid();
  fprintf(__stream,
          "ERROR [%d/%d][%s:%u] - GOTCHA attempted to mark both GOT and PLT GOT tables as writable and was unable to do so, calls to wrapped functions may likely fail.\n"
          ,(ulong)uVar1,(ulong)uVar2,"gotcha.c",0x147);
  return;
}

Assistant:

static int mark_got_writable(struct link_map *lib) {
  static ElfW(Addr) page_size = 0;
  INIT_DYNAMIC(lib);
  if (!got) return 0;

  if (!page_size) page_size = gotcha_getpagesize();

  ElfW(Addr) plt_got_size = MAX(rel_size, page_size);
  if (plt_got_size % page_size) {  // GCOVR_EXCL_START
    plt_got_size += page_size - ((plt_got_size) % page_size);
  }  // GCOVR_EXCL_STOP
  ElfW(Addr) plt_got_addr = BOUNDARY_BEFORE(got, (ElfW(Addr))page_size);
  struct Boundary boundary;
  boundary.l_name = lib->l_name;
  boundary.load_addr = lib->l_addr;
  boundary.found = 0;
  dl_iterate_phdr(find_relro_boundary, &boundary);
  int plt_got_written = 0;
  if (boundary.found) {
    ElfW(Addr) got_end = MAX(boundary.end_addr, page_size);
    if (got_end % page_size) {
      got_end += page_size - ((got_end) % page_size);  // GCOVR_EXCL_LINE
    }
    ElfW(Addr) got_addr =
        BOUNDARY_BEFORE(boundary.start_addr, (ElfW(Addr))page_size);
    ElfW(Addr) got_size = got_end - got_addr;
    /**
     * The next two cases are to optimize mprotect calls to do both pages
     * together if they align. We do not have such usecase yet and hence
     * ignoring from coverage.
     */
    if (got_addr == plt_got_addr + plt_got_size) {
      // Haven't seen a library till now where got_addr > plt_got_addr
      // GCOVR_EXCL_START
      debug_printf(3,
                   "Setting library %s GOT and PLT table "
                   "from %p to +%lu to writeable\n",
                   LIB_NAME(lib), (void *)plt_got_addr,
                   plt_got_size + got_size);
      int res = gotcha_mprotect((void *)plt_got_addr, plt_got_size + got_size,
                                PROT_READ | PROT_WRITE | PROT_EXEC);
      // mprotect returns -1 on an error
      if (res == -1) {
        error_printf(
            "GOTCHA attempted to mark both GOT and PLT GOT tables as writable "
            "and was unable to do so, "
            "calls to wrapped functions may likely fail.\n");
      }
      plt_got_written = 1;
      // GCOVR_EXCL_STOP
    } else if (plt_got_addr == got_addr + got_size) {
      // This is a more common case.
      debug_printf(3,
                   "Setting library %s GOT and PLT table "
                   "from %p to +%lu to writeable\n",
                   LIB_NAME(lib), (void *)got_addr, plt_got_size + got_size);
      int res = gotcha_mprotect((void *)got_addr, plt_got_size + got_size,
                                PROT_READ | PROT_WRITE | PROT_EXEC);
      // mprotect returns -1 on an error
      if (res == -1) {  // GCOVR_EXCL_START
        error_printf(
            "GOTCHA attempted to mark both GOT and PLT GOT tables as writable "
            "and was unable to do so, "
            "calls to wrapped functions may likely fail.\n");
      }  // GCOVR_EXCL_STOP
      plt_got_written = 1;
    } else {
      debug_printf(
          3, "Setting library %s only GOT table from %p to +%lu to writeable\n",
          LIB_NAME(lib), (void *)got_addr, got_size);
      int res = gotcha_mprotect((void *)got_addr, got_size,
                                PROT_READ | PROT_WRITE | PROT_EXEC);
      if (res == -1) {  // GCOVR_EXCL_START
        error_printf(
            "GOTCHA attempted to mark the only GOT table as writable and was "
            "unable to do so, "
            "calls to wrapped functions may likely fail.\n");
      }  // GCOVR_EXCL_STOP
    }
  }
  if (!plt_got_written) {
    debug_printf(
        3,
        "Setting library %s only PLT GOT table from %p to +%lu to writeable\n",
        LIB_NAME(lib), (void *)plt_got_addr, plt_got_size);
    int res = gotcha_mprotect((void *)plt_got_addr, plt_got_size,
                              PROT_READ | PROT_WRITE | PROT_EXEC);
    // mprotect returns -1 on an error
    if (res == -1) {  // GCOVR_EXCL_START
      error_printf(
          "GOTCHA attempted to mark the only PLT GOT table as writable and was "
          "unable to do so, "
          "calls to wrapped functions may likely fail.\n");
    }  // GCOVR_EXCL_STOP
  }
  return 0;
}